

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::getVLV(Binasc *this,istream *infile,int *trackbytes)

{
  uint uVar1;
  uchar ch;
  
  std::istream::read((char *)infile,(long)&ch);
  *trackbytes = *trackbytes + 1;
  uVar1 = ch & 0x7f;
  while ((char)ch < '\0') {
    std::istream::read((char *)infile,(long)&ch);
    *trackbytes = *trackbytes + 1;
    uVar1 = uVar1 << 7 | ch & 0x7f;
  }
  return uVar1;
}

Assistant:

int Binasc::getVLV(std::istream& infile, int& trackbytes) {
	int output = 0;
	uchar ch;
	infile.read((char*)&ch, 1);
	trackbytes++;
	output = (output << 7) | (0x7f & ch);
	while (ch >= 0x80) {
		infile.read((char*)&ch, 1);
		trackbytes++;
		output = (output << 7) | (0x7f & ch);
	}
	return output;
}